

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_property.c
# Opt level: O3

int setHistfile(mpt_logfile *log,mpt_convertable *src)

{
  FILE *__stream;
  int iVar1;
  FILE *pFVar2;
  int sock;
  char *where;
  int local_1c;
  char *local_18;
  
  local_18 = (char *)0x0;
  local_1c = -1;
  if ((log->state & 0x10) != 0) {
    return -0x21;
  }
  if (src != (mpt_convertable *)0x0) {
    iVar1 = (*src->_vptr->convert)(src,1,&local_1c);
    if (iVar1 < 0) {
      iVar1 = (*src->_vptr->convert)(src,0x73,&local_18);
      if (iVar1 < 0) {
        return -3;
      }
      if (local_18 != (char *)0x0) {
        pFVar2 = fopen(local_18,"w");
        if (pFVar2 == (FILE *)0x0) {
          return -1;
        }
        goto LAB_0011863c;
      }
    }
    else if (-1 < local_1c) {
      local_1c = dup(local_1c);
      if (local_1c < 0) {
        return -4;
      }
      pFVar2 = fdopen(local_1c,"w");
      if (pFVar2 == (FILE *)0x0) {
        close(local_1c);
        return -1;
      }
      goto LAB_0011863c;
    }
  }
  pFVar2 = (FILE *)0x0;
LAB_0011863c:
  __stream = (FILE *)log->file;
  if (((__stream != (FILE *)0x0) && (__stream != _stdout)) && (__stream != _stderr)) {
    fclose(__stream);
  }
  log->file = (FILE *)pFVar2;
  return 0;
}

Assistant:

static int setHistfile(MPT_STRUCT(logfile) *log, MPT_INTERFACE(convertable) *src)
{
	const char *where = 0;
	FILE *fd;
	int sock = -1;
	
	if (log->state & MPT_OUTFLAG(Active)) {
		return MPT_MESGERR(InProgress);
	}
	/* default output */
	if (!src) {
		fd = 0;
	}
	/* use socket descriptor */
	else if (src->_vptr->convert(src, MPT_ENUM(TypeUnixSocket), &sock) >= 0) {
		if (sock < 0) {
			fd = 0;
		}
		else if ((sock = dup(sock)) < 0) {
			return MPT_ERROR(BadOperation);
		}
		else if (!(fd = fdopen(sock, "w"))) {
			close(sock);
			return MPT_ERROR(BadArgument);
		}
	}
	/* use file path */
	else if (src->_vptr->convert(src, 's', &where) >= 0) {
		fd = 0;
		/* regular file path */
		if (where && !(fd = fopen(where, "w"))) {
			return MPT_ERROR(BadArgument);
		}
	}
	else {
		return MPT_ERROR(BadType);
	}
	if (log->file && (log->file != stdout) && (log->file != stderr)) {
		fclose(log->file);
	}
	log->file = fd;
	
	return 0;
}